

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O0

void __thiscall hanabi_learning_env::HanabiState::ApplyMove(HanabiState *this,HanabiMove move)

{
  HanabiCard card;
  HanabiMove move_00;
  bool bVar1;
  int8_t iVar2;
  Type TVar3;
  int iVar4;
  AgentObservationType AVar5;
  int iVar6;
  HanabiGame *pHVar7;
  reference pvVar8;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *pvVar9;
  const_reference pvVar10;
  HanabiState *this_00;
  HanabiMove in_RSI;
  HanabiState *in_RDI;
  CardKnowledge card_knowledge;
  HanabiHistoryItem history;
  undefined8 in_stack_fffffffffffffe98;
  HanabiState *in_stack_fffffffffffffea0;
  HanabiState *in_stack_fffffffffffffea8;
  HanabiCard in_stack_fffffffffffffeb0;
  HanabiState *in_stack_fffffffffffffeb8;
  undefined4 local_138;
  int iVar11;
  undefined4 uStack_12c;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  HanabiHand *in_stack_ffffffffffffff00;
  undefined5 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff25;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  Type in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  HanabiHistoryItem local_28 [2];
  HanabiMove local_8;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  move_00._4_4_ = in_stack_ffffffffffffff30;
  move_00.move_type_ = in_stack_ffffffffffffff2c;
  local_8 = in_RSI;
  bVar1 = MoveIsLegal((HanabiState *)
                      CONCAT17(in_stack_ffffffffffffff27,
                               CONCAT16(in_stack_ffffffffffffff26,
                                        CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20
                                                ))),move_00);
  if (!bVar1) {
    __assert_fail("MoveIsLegal(move)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_state.cc"
                  ,0xde,"void hanabi_learning_env::HanabiState::ApplyMove(HanabiMove)");
  }
  bVar1 = HanabiDeck::Empty(&in_RDI->deck_);
  if (bVar1) {
    in_RDI->turns_to_play_ = in_RDI->turns_to_play_ + -1;
  }
  HanabiHistoryItem::HanabiHistoryItem(local_28,local_8);
  local_28[0].player = (int8_t)in_RDI->cur_player_;
  TVar3 = HanabiMove::MoveType(&local_8);
  switch(TVar3) {
  case kPlay:
    pvVar8 = std::
             vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ::operator[](&in_RDI->hands_,(long)in_RDI->cur_player_);
    this_00 = (HanabiState *)HanabiHand::Cards(pvVar8);
    iVar2 = HanabiMove::CardIndex(&local_8);
    pvVar10 = std::
              vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
              ::operator[]((vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                            *)this_00,(long)iVar2);
    iVar6 = HanabiCard::Color(pvVar10);
    local_28[0].color = (int8_t)iVar6;
    pvVar8 = std::
             vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ::operator[](&in_RDI->hands_,(long)in_RDI->cur_player_);
    pvVar9 = HanabiHand::Cards(pvVar8);
    local_138 = SUB84(pvVar9,0);
    iVar11 = (int)((ulong)pvVar9 >> 0x20);
    iVar2 = HanabiMove::CardIndex(&local_8);
    pvVar10 = std::
              vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
              ::operator[]((vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                            *)CONCAT44(iVar11,local_138),(long)iVar2);
    iVar6 = HanabiCard::Rank(pvVar10);
    local_28[0].rank = (int8_t)iVar6;
    pvVar8 = std::
             vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ::operator[](&in_RDI->hands_,(long)in_RDI->cur_player_);
    pvVar9 = HanabiHand::Cards(pvVar8);
    iVar6 = (int)pvVar9;
    uStack_12c = (undefined4)((ulong)pvVar9 >> 0x20);
    iVar2 = HanabiMove::CardIndex(&local_8);
    std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
    operator[]((vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                *)CONCAT44(uStack_12c,iVar6),(long)iVar2);
    card.rank_ = iVar6;
    card.color_ = iVar11;
    AddToFireworks(this_00,card);
    std::tie<bool,bool>((bool *)in_stack_fffffffffffffea8,(bool *)in_stack_fffffffffffffea0);
    std::tuple<bool&,bool&>::operator=
              ((tuple<bool_&,_bool_&> *)in_stack_fffffffffffffeb0,
               (pair<bool,_bool> *)in_stack_fffffffffffffea8);
    std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
    operator[](&in_RDI->hands_,(long)in_RDI->cur_player_);
    HanabiMove::CardIndex(&local_8);
    HanabiHand::RemoveFromHand(in_stack_ffffffffffffff00,iVar4,in_stack_fffffffffffffef0);
    break;
  case kDiscard:
    local_28[0].information_token = IncrementInformationTokens(in_stack_fffffffffffffea8);
    pvVar8 = std::
             vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ::operator[](&in_RDI->hands_,(long)in_RDI->cur_player_);
    pvVar9 = HanabiHand::Cards(pvVar8);
    iVar2 = HanabiMove::CardIndex(&local_8);
    pvVar10 = std::
              vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
              ::operator[](pvVar9,(long)iVar2);
    iVar4 = HanabiCard::Color(pvVar10);
    local_28[0].color = (int8_t)iVar4;
    pvVar8 = std::
             vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ::operator[](&in_RDI->hands_,(long)in_RDI->cur_player_);
    pvVar9 = HanabiHand::Cards(pvVar8);
    iVar2 = HanabiMove::CardIndex(&local_8);
    pvVar10 = std::
              vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
              ::operator[](pvVar9,(long)iVar2);
    iVar4 = HanabiCard::Rank(pvVar10);
    local_28[0].rank = (int8_t)iVar4;
    pvVar8 = std::
             vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ::operator[](&in_RDI->hands_,(long)in_RDI->cur_player_);
    iVar4 = (int)((ulong)pvVar8 >> 0x20);
    HanabiMove::CardIndex(&local_8);
    HanabiHand::RemoveFromHand(in_stack_ffffffffffffff00,iVar4,pvVar9);
    break;
  case kRevealColor:
    DecrementInformationTokens(in_stack_fffffffffffffea0);
    iVar4 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    HanabiMove::TargetOffset(&local_8);
    in_stack_fffffffffffffea8 =
         (HanabiState *)HandByOffset((HanabiState *)in_stack_fffffffffffffeb0,iVar4);
    HanabiMove::Color(&local_8);
    local_28[0].reveal_bitmask =
         anon_unknown_6::HandColorBitmask
                   ((HanabiHand *)in_stack_fffffffffffffeb0,
                    (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    HanabiMove::TargetOffset(&local_8);
    in_stack_fffffffffffffeb0 =
         (HanabiCard)
         HandByOffset((HanabiState *)in_stack_fffffffffffffeb0,
                      (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    HanabiMove::Color(&local_8);
    local_28[0].newly_revealed_bitmask =
         HanabiHand::RevealColor
                   ((HanabiHand *)in_stack_fffffffffffffeb0,
                    (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    break;
  case kRevealRank:
    DecrementInformationTokens(in_stack_fffffffffffffea0);
    HanabiMove::TargetOffset(&local_8);
    HandByOffset((HanabiState *)in_stack_fffffffffffffeb0,
                 (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    HanabiMove::Rank(&local_8);
    local_28[0].reveal_bitmask =
         anon_unknown_6::HandRankBitmask
                   ((HanabiHand *)in_stack_fffffffffffffeb0,
                    (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    HanabiMove::TargetOffset(&local_8);
    in_stack_fffffffffffffea0 =
         (HanabiState *)
         HandByOffset((HanabiState *)in_stack_fffffffffffffeb0,
                      (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    HanabiMove::Rank(&local_8);
    local_28[0].newly_revealed_bitmask =
         HanabiHand::RevealRank
                   ((HanabiHand *)in_stack_fffffffffffffeb0,
                    (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    break;
  case kDeal:
    iVar4 = PlayerToDeal(in_stack_fffffffffffffeb8);
    local_28[0].deal_to_player = (int8_t)iVar4;
    pHVar7 = ParentGame(in_RDI);
    HanabiGame::NumColors(pHVar7);
    pHVar7 = ParentGame(in_RDI);
    HanabiGame::NumRanks(pHVar7);
    HanabiHand::CardKnowledge::CardKnowledge
              ((CardKnowledge *)in_stack_fffffffffffffeb0,
               (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8);
    AVar5 = HanabiGame::ObservationType(in_RDI->parent_game_);
    if (AVar5 == kSeer) {
      HanabiMove::Color(&local_8);
      iVar4 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
      HanabiHand::CardKnowledge::ApplyIsColorHint((CardKnowledge *)in_stack_fffffffffffffea0,iVar4);
      HanabiMove::Rank(&local_8);
      HanabiHand::CardKnowledge::ApplyIsRankHint((CardKnowledge *)in_stack_fffffffffffffea0,iVar4);
    }
    std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
    operator[](&in_RDI->hands_,(long)local_28[0].deal_to_player);
    HanabiMove::Color(&local_8);
    HanabiMove::Rank(&local_8);
    HanabiDeck::DealCard
              ((HanabiDeck *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0.rank_,
               in_stack_fffffffffffffeb0.color_);
    HanabiHand::AddCard((HanabiHand *)in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,
                        (CardKnowledge *)in_stack_fffffffffffffea0);
    HanabiHand::CardKnowledge::~CardKnowledge((CardKnowledge *)in_stack_fffffffffffffea0);
    break;
  default:
    abort();
  }
  std::
  vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ::push_back((vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
               *)in_stack_fffffffffffffeb0,(value_type *)in_stack_fffffffffffffea8);
  AdvanceToNextPlayer(in_stack_fffffffffffffea0);
  return;
}

Assistant:

void HanabiState::ApplyMove(HanabiMove move) {
  REQUIRE(MoveIsLegal(move));
  if (deck_.Empty()) {
    --turns_to_play_;
  }
  HanabiHistoryItem history(move);
  history.player = cur_player_;
  switch (move.MoveType()) {
    case HanabiMove::kDeal: {
        history.deal_to_player = PlayerToDeal();
        HanabiHand::CardKnowledge card_knowledge(ParentGame()->NumColors(),
                                      ParentGame()->NumRanks());
        if (parent_game_->ObservationType() == HanabiGame::kSeer){
          card_knowledge.ApplyIsColorHint(move.Color());
          card_knowledge.ApplyIsRankHint(move.Rank());
        }
        hands_[history.deal_to_player].AddCard(
            deck_.DealCard(move.Color(), move.Rank()),
            card_knowledge);
      }
      break;
    case HanabiMove::kDiscard:
      history.information_token = IncrementInformationTokens();
      history.color = hands_[cur_player_].Cards()[move.CardIndex()].Color();
      history.rank = hands_[cur_player_].Cards()[move.CardIndex()].Rank();
      hands_[cur_player_].RemoveFromHand(move.CardIndex(), &discard_pile_);
      break;
    case HanabiMove::kPlay:
      history.color = hands_[cur_player_].Cards()[move.CardIndex()].Color();
      history.rank = hands_[cur_player_].Cards()[move.CardIndex()].Rank();
      std::tie(history.scored, history.information_token) =
          AddToFireworks(hands_[cur_player_].Cards()[move.CardIndex()]);
      hands_[cur_player_].RemoveFromHand(
          move.CardIndex(), history.scored ? nullptr : &discard_pile_);
      break;
    case HanabiMove::kRevealColor:
      DecrementInformationTokens();
      history.reveal_bitmask =
          HandColorBitmask(*HandByOffset(move.TargetOffset()), move.Color());
      history.newly_revealed_bitmask =
          HandByOffset(move.TargetOffset())->RevealColor(move.Color());
      break;
    case HanabiMove::kRevealRank:
      DecrementInformationTokens();
      history.reveal_bitmask =
          HandRankBitmask(*HandByOffset(move.TargetOffset()), move.Rank());
      history.newly_revealed_bitmask =
          HandByOffset(move.TargetOffset())->RevealRank(move.Rank());
      break;
    default:
      std::abort();  // Should not be possible.
  }
  move_history_.push_back(history);
  AdvanceToNextPlayer();
}